

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

void __thiscall ezc3d::ParametersNS::Parameters::group(Parameters *this,Group *g)

{
  int iVar1;
  Parameter *pPVar2;
  Group *this_00;
  size_t sVar3;
  Group *in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  size_t alreadyExtIdx;
  size_t in_stack_00000098;
  Parameters *in_stack_000000a0;
  size_t in_stack_000000d8;
  Group *in_stack_000000e0;
  string *in_stack_00000978;
  Parameters *in_stack_00000980;
  value_type *in_stack_ffffffffffffffb8;
  ulong uVar4;
  string *in_stack_ffffffffffffffc0;
  ulong local_28;
  Parameter *local_20;
  Parameter *p;
  
  p = (Parameter *)0xffffffffffffffff;
  for (local_20 = (Parameter *)0x0; pPVar2 = (Parameter *)nbGroups((Parameters *)0x16fa3e),
      local_20 < pPVar2; local_20 = (Parameter *)&(local_20->_name).field_0x1) {
    this_00 = group(in_stack_000000a0,in_stack_00000098);
    in_stack_ffffffffffffffc0 = GroupNS::Group::name_abi_cxx11_(this_00);
    GroupNS::Group::name_abi_cxx11_(in_RSI);
    iVar1 = std::__cxx11::string::compare((string *)in_stack_ffffffffffffffc0);
    if (iVar1 == 0) {
      p = local_20;
    }
  }
  if (p == (Parameter *)0xffffffffffffffff) {
    std::
    vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
    ::push_back((vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                 *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    local_28 = 0;
    while (uVar4 = local_28, sVar3 = GroupNS::Group::nbParameters((Group *)0x16fad9), uVar4 < sVar3)
    {
      std::
      vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
      ::operator[]((vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                    *)(in_RDI + 0x20),(size_type)p);
      GroupNS::Group::parameter(in_stack_000000e0,in_stack_000000d8);
      GroupNS::Group::parameter(in_RSI,p);
      local_28 = local_28 + 1;
    }
  }
  GroupNS::Group::name_abi_cxx11_(in_RSI);
  setMandatoryParametersForSpecialGroup(in_stack_00000980,in_stack_00000978);
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::group(
    const ezc3d::ParametersNS::GroupNS::Group &g) {
  // If the group already exist, override and merge
  size_t alreadyExtIdx(SIZE_MAX);
  for (size_t i = 0; i < nbGroups(); ++i)
    if (!group(i).name().compare(g.name()))
      alreadyExtIdx = i;
  if (alreadyExtIdx == SIZE_MAX)
    _groups.push_back(g);
  else {
    for (size_t i = 0; i < g.nbParameters(); ++i)
      _groups[alreadyExtIdx].parameter(g.parameter(i));
  }

  // Do a sanity check for some specific group
  setMandatoryParametersForSpecialGroup(g.name());
}